

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

Fl_Widget * __thiscall Fl_Tabs::which(Fl_Tabs *this,int event_x,int event_y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_38;
  int i;
  int nc;
  Fl_Widget *ret;
  int H;
  int event_y_local;
  int event_x_local;
  Fl_Tabs *this_local;
  
  iVar1 = Fl_Group::children(&this->super_Fl_Group);
  if (iVar1 == 0) {
    return (Fl_Widget *)0x0;
  }
  iVar1 = tab_height(this);
  if (iVar1 < 0) {
    iVar2 = Fl_Widget::y((Fl_Widget *)this);
    iVar3 = Fl_Widget::h((Fl_Widget *)this);
    if (event_y <= iVar2 + iVar3) {
      iVar2 = Fl_Widget::y((Fl_Widget *)this);
      iVar3 = Fl_Widget::h((Fl_Widget *)this);
      if (iVar2 + iVar3 + iVar1 <= event_y) goto LAB_002194c9;
    }
    this_local = (Fl_Tabs *)0x0;
  }
  else {
    iVar2 = Fl_Widget::y((Fl_Widget *)this);
    if ((iVar2 + iVar1 < event_y) || (iVar1 = Fl_Widget::y((Fl_Widget *)this), event_y < iVar1)) {
      return (Fl_Widget *)0x0;
    }
LAB_002194c9:
    iVar1 = Fl_Widget::x((Fl_Widget *)this);
    if (event_x < iVar1) {
      this_local = (Fl_Tabs *)0x0;
    }
    else {
      _i = (Fl_Tabs *)0x0;
      iVar1 = Fl_Group::children(&this->super_Fl_Group);
      tab_positions(this);
      for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
        iVar2 = Fl_Widget::x((Fl_Widget *)this);
        if (event_x < iVar2 + this->tab_pos[local_38 + 1]) {
          _i = (Fl_Tabs *)Fl_Group::child(&this->super_Fl_Group,local_38);
          break;
        }
      }
      this_local = _i;
    }
  }
  return (Fl_Widget *)this_local;
}

Assistant:

Fl_Widget *Fl_Tabs::which(int event_x, int event_y) {
  if (children() == 0) return 0;
  int H = tab_height();
  if (H < 0) {
    if (event_y > y()+h() || event_y < y()+h()+H) return 0;
  } else {
    if (event_y > y()+H || event_y < y()) return 0;
  }
  if (event_x < x()) return 0;
  Fl_Widget *ret = 0L;
  const int nc = children();
  tab_positions();
  for (int i=0; i<nc; i++) {
    if (event_x < x()+tab_pos[i+1]) {
      ret = child(i);
      break;
    }
  }
  return ret;
}